

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O0

string * generate_no_db_page_abi_cxx11_(query_table_type *query_params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *result;
  query_table_type *query_params_local;
  
  result = (string *)query_params;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar1,&pluginInstance.header);
  local_18 = pbVar1;
  sVar2 = std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::size
                    (RenX::ladder_databases);
  pbVar1 = local_18;
  if (sVar2 == 0) {
    local_88 = sv("Error: No ladder databases loaded",0x21);
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)pbVar1,&local_88);
  }
  else {
    generate_search_abi_cxx11_(&local_48,(LadderDatabase *)0x0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (pbVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pbVar1 = local_18;
    generate_database_selector_abi_cxx11_
              (&local_68,(LadderDatabase *)0x0,(query_table_type *)result);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (pbVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    pbVar1 = local_18;
    local_78 = sv("Error: No such database exists",0x1e);
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)pbVar1,&local_78);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (local_18,&pluginInstance.footer);
  return local_18;
}

Assistant:

std::string* generate_no_db_page(const query_table_type& query_params) {
	std::string* result = new std::string(pluginInstance.header);
	if (RenX::ladder_databases.size() != 0) {
		result->append(generate_search(nullptr));
		result->append(generate_database_selector(nullptr, query_params));
		result->append("Error: No such database exists"sv);
	}
	else {
		result->append("Error: No ladder databases loaded"sv);
	}
	result->append(pluginInstance.footer);
	return result;
}